

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O0

void __thiscall
MockQuicTransport::MockQuicTransport(MockQuicTransport *this,UniquePtr<BIO> *bio,SSL *ssl)

{
  allocator<MockQuicTransport::EncryptionLevel> local_35 [20];
  allocator<MockQuicTransport::EncryptionLevel> local_21;
  SSL *local_20;
  SSL *ssl_local;
  UniquePtr<BIO> *bio_local;
  MockQuicTransport *this_local;
  
  local_20 = ssl;
  ssl_local = (SSL *)bio;
  bio_local = &this->bio_;
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::unique_ptr(&this->bio_,bio);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pending_app_data_);
  std::allocator<MockQuicTransport::EncryptionLevel>::allocator(&local_21);
  std::
  vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>::
  vector(&this->read_levels_,4,&local_21);
  std::allocator<MockQuicTransport::EncryptionLevel>::~allocator(&local_21);
  std::allocator<MockQuicTransport::EncryptionLevel>::allocator(local_35);
  std::
  vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>::
  vector(&this->write_levels_,4,local_35);
  std::allocator<MockQuicTransport::EncryptionLevel>::~allocator(local_35);
  this->ssl_ = local_20;
  return;
}

Assistant:

MockQuicTransport::MockQuicTransport(bssl::UniquePtr<BIO> bio, SSL *ssl)
    : bio_(std::move(bio)),
      read_levels_(ssl_encryption_application + 1),
      write_levels_(ssl_encryption_application + 1),
      ssl_(ssl) {}